

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_tostring.hpp
# Opt level: O0

string * __thiscall
Catch::Detail::rangeToString<double_const*,double_const*>
          (string *__return_storage_ptr__,Detail *this,double *first,double *last)

{
  ReusableStringStream *this_00;
  string local_80;
  string local_60;
  undefined1 local_30 [8];
  ReusableStringStream rss;
  double *last_local;
  double *first_local;
  
  rss.m_oss = (ostream *)first;
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_30);
  ReusableStringStream::operator<<((ReusableStringStream *)local_30,(char (*) [3])"{ ");
  if (this != (Detail *)rss.m_oss) {
    stringify<double>(&local_60,(double *)this);
    ReusableStringStream::operator<<((ReusableStringStream *)local_30,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    for (last_local = (double *)(this + 8); (ostream *)last_local != rss.m_oss;
        last_local = last_local + 1) {
      this_00 = ReusableStringStream::operator<<
                          ((ReusableStringStream *)local_30,(char (*) [3])", ");
      stringify<double>(&local_80,last_local);
      ReusableStringStream::operator<<(this_00,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
  }
  ReusableStringStream::operator<<((ReusableStringStream *)local_30,(char (*) [3])" }");
  ReusableStringStream::str_abi_cxx11_(__return_storage_ptr__,(ReusableStringStream *)local_30);
  ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string rangeToString(InputIterator first, Sentinel last) {
            ReusableStringStream rss;
            rss << "{ ";
            if (first != last) {
                rss << ::Catch::Detail::stringify(*first);
                for (++first; first != last; ++first)
                    rss << ", " << ::Catch::Detail::stringify(*first);
            }
            rss << " }";
            return rss.str();
        }